

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_functions.cpp
# Opt level: O3

void duckdb::EnumRangeFunction(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference pvVar1;
  long lVar2;
  long lVar3;
  vector<duckdb::Value,_true> enum_values;
  vector<duckdb::LogicalType,_true> types;
  Value val;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_d8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_b8;
  LogicalType local_a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_88;
  Value local_70 [64];
  
  duckdb::DataChunk::GetTypes();
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&local_88,0);
  lVar2 = duckdb::EnumType::GetSize(pvVar1);
  pvVar1 = vector<duckdb::LogicalType,_true>::operator[]
                     ((vector<duckdb::LogicalType,_true> *)&local_88,0);
  duckdb::EnumType::GetValuesInsertOrder(pvVar1);
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (lVar2 != 0) {
    lVar3 = 0;
    do {
      duckdb::Vector::GetValue((ulong)local_70);
      std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
                (&local_d8,local_70);
      duckdb::Value::~Value(local_70);
      lVar3 = lVar3 + 1;
    } while (lVar2 != lVar3);
  }
  duckdb::LogicalType::LogicalType(local_a0,VARCHAR);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector(&local_b8,&local_d8);
  duckdb::Value::LIST(local_70,local_a0,&local_b8);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_b8);
  duckdb::LogicalType::~LogicalType(local_a0);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_70);
  std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector(&local_d8);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_88);
  return;
}

Assistant:

static void EnumRangeFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto types = input.GetTypes();
	D_ASSERT(types.size() == 1);
	auto enum_size = EnumType::GetSize(types[0]);
	auto &enum_vector = EnumType::GetValuesInsertOrder(types[0]);
	vector<Value> enum_values;
	for (idx_t i = 0; i < enum_size; i++) {
		enum_values.emplace_back(enum_vector.GetValue(i));
	}
	auto val = Value::LIST(LogicalType::VARCHAR, enum_values);
	result.Reference(val);
}